

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O1

void __thiscall
slang::ast::ConcatenationExpression::serializeTo
          (ConcatenationExpression *this,ASTSerializer *serializer)

{
  size_type sVar1;
  pointer ppEVar2;
  long lVar3;
  string_view name;
  
  if ((this->operands_).size_ != 0) {
    name._M_str = "operands";
    name._M_len = 8;
    ASTSerializer::startArray(serializer,name);
    sVar1 = (this->operands_).size_;
    if (sVar1 != 0) {
      ppEVar2 = (this->operands_).data_;
      lVar3 = 0;
      do {
        ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar3));
        lVar3 = lVar3 + 8;
      } while (sVar1 << 3 != lVar3);
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

span_nodiscard span_constexpr bool empty() const span_noexcept
    {
        return size() == 0;
    }